

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_sparray.cpp
# Opt level: O3

void __thiscall
SectionSpArray_IndicesBeginEnd_Test::~SectionSpArray_IndicesBeginEnd_Test
          (SectionSpArray_IndicesBeginEnd_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (SectionSpArray, IndicesBeginEnd) {
    std::vector<section_kind> const indices{section_kind::text, section_kind::data};
    using sparray = section_sparray<int>;

    std::vector<std::uint8_t> storage;
    storage.resize (sparray::size_bytes (indices.size ()));

    auto arr = make_placement_unique_ptr<sparray> (storage.data (), std::begin (indices),
                                                   std::end (indices));
    std::vector<section_kind> c{arr->get_indices ().begin (), arr->get_indices ().end ()};
    EXPECT_THAT (c, testing::ElementsAre (section_kind::text, section_kind::data));
}